

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O2

_HashNode * __thiscall SQTable::_GetStr(SQTable *this,SQRawObjectVal key,SQHash hash)

{
  _HashNode *p_Var1;
  
  p_Var1 = this->_nodes + hash;
  while (((p_Var1->key).super_SQObject._unVal.pTable != (SQTable *)key ||
         ((p_Var1->key).super_SQObject._type != OT_STRING))) {
    p_Var1 = p_Var1->next;
    if (p_Var1 == (_HashNode *)0x0) {
      return (_HashNode *)0x0;
    }
  }
  return p_Var1;
}

Assistant:

inline _HashNode *_GetStr(const SQRawObjectVal key, SQHash hash) const
    {
        _HashNode *n = &_nodes[hash];
        do{
            if(_rawval(n->key) == key && sq_type(n->key) == OT_STRING){
                return n;
            }
        }while((n = n->next));
        return NULL;
    }